

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

bool boost::ext::ut::v1_1_8::detail::
     on<boost::ext::ut::v1_1_8::detail::eq_<unsigned_long,boost::ext::ut::v1_1_8::detail::integral_constant<0ul>>,boost::ext::ut::v1_1_8::events::assertion<boost::ext::ut::v1_1_8::detail::eq_<unsigned_long,boost::ext::ut::v1_1_8::detail::integral_constant<0ul>>>>
               (assertion<boost::ext::ut::v1_1_8::detail::eq_<unsigned_long,_boost::ext::ut::v1_1_8::detail::integral_constant<0UL>_>_>
                *event)

{
  bool bVar1;
  
  bVar1 = runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>::
          on<boost::ext::ut::v1_1_8::detail::eq_<unsigned_long,boost::ext::ut::v1_1_8::detail::integral_constant<0ul>>>
                    ((runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *
                     )cfg<boost::ext::ut::v1_1_8::override>,*event);
  return bVar1;
}

Assistant:

[[nodiscard]] constexpr decltype(auto) on(TEvent&& event) {
  return ut::cfg<typename type_traits::identity<override, Ts...>::type>.on(
      static_cast<TEvent&&>(event));
}